

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_mstring_get_mbs(archive *a,archive_mstring *aes,char **p)

{
  wchar_t wVar1;
  char *pcVar2;
  archive_string_conv *sc;
  wchar_t wVar3;
  
  wVar1 = aes->aes_set;
  if ((wVar1 & 1U) != 0) {
    *p = (aes->aes_mbs).s;
    return L'\0';
  }
  *p = (char *)0x0;
  wVar3 = L'\0';
  if ((wVar1 & 4U) != 0) {
    (aes->aes_mbs).length = 0;
    wVar1 = archive_string_append_from_wcs(&aes->aes_mbs,(aes->aes_wcs).s,(aes->aes_wcs).length);
    *p = (aes->aes_mbs).s;
    wVar3 = L'\xffffffff';
    if (wVar1 == L'\0') goto LAB_00163263;
  }
  if ((aes->aes_set & L'\x02') == L'\0') {
    return wVar3;
  }
  (aes->aes_mbs).length = 0;
  pcVar2 = get_current_charset(a);
  sc = get_sconv_object(a,"UTF-8",pcVar2,L'\x06');
  if (sc == (archive_string_conv *)0x0) {
    return L'\xffffffff';
  }
  pcVar2 = (aes->aes_utf8).s;
  (aes->aes_mbs).length = 0;
  wVar1 = archive_strncat_l(&aes->aes_mbs,pcVar2,(aes->aes_utf8).length,sc);
  if (a == (archive *)0x0) {
    free_sconv_object(sc);
  }
  *p = (aes->aes_mbs).s;
  if (wVar1 != L'\0') {
    return L'\xffffffff';
  }
LAB_00163263:
  *(byte *)&aes->aes_set = (byte)aes->aes_set | 1;
  return L'\0';
}

Assistant:

int
archive_mstring_get_mbs(struct archive *a, struct archive_mstring *aes,
    const char **p)
{
	struct archive_string_conv *sc;
	int r, ret = 0;

	/* If we already have an MBS form, return that immediately. */
	if (aes->aes_set & AES_SET_MBS) {
		*p = aes->aes_mbs.s;
		return (ret);
	}

	*p = NULL;
	/* If there's a WCS form, try converting with the native locale. */
	if (aes->aes_set & AES_SET_WCS) {
		archive_string_empty(&(aes->aes_mbs));
		r = archive_string_append_from_wcs(&(aes->aes_mbs),
		    aes->aes_wcs.s, aes->aes_wcs.length);
		*p = aes->aes_mbs.s;
		if (r == 0) {
			aes->aes_set |= AES_SET_MBS;
			return (ret);
		} else
			ret = -1;
	}

	/* If there's a UTF-8 form, try converting with the native locale. */
	if (aes->aes_set & AES_SET_UTF8) {
		archive_string_empty(&(aes->aes_mbs));
		sc = archive_string_conversion_from_charset(a, "UTF-8", 1);
		if (sc == NULL)
			return (-1);/* Couldn't allocate memory for sc. */
		r = archive_strncpy_l(&(aes->aes_mbs),
			aes->aes_utf8.s, aes->aes_utf8.length, sc);
		if (a == NULL)
			free_sconv_object(sc);
		*p = aes->aes_mbs.s;
		if (r == 0) {
			aes->aes_set |= AES_SET_MBS;
			ret = 0;/* success; overwrite previous error. */
		} else
			ret = -1;/* failure. */
	}
	return (ret);
}